

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

void __thiscall kj::InsertionOrderIndex::eraseImpl(InsertionOrderIndex *this,size_t pos)

{
  Link *__s;
  Link *link;
  size_t pos_local;
  InsertionOrderIndex *this_local;
  
  __s = this->links + pos + 1;
  this->links[__s->next].prev = __s->prev;
  this->links[__s->prev].next = __s->next;
  memset(__s,0xff,8);
  return;
}

Assistant:

void InsertionOrderIndex::eraseImpl(size_t pos) {
  Link& link = links[pos + 1];
  links[link.next].prev = link.prev;
  links[link.prev].next = link.next;

#ifdef KJ_DEBUG
  memset(&link, 0xff, sizeof(Link));
#endif
}